

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

char * GetID(char **p)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *local_20;
  char *np;
  char **p_local;
  
  local_20 = nidtemp;
  iVar3 = SkipBlanks(p);
  if ((iVar3 == 0) && ((bVar2 = isLabelStart(*p,false), bVar2 || (**p == '.')))) {
    while (iVar3 = islabchar(**p), iVar3 != 0) {
      pcVar1 = *p;
      *p = pcVar1 + 1;
      *local_20 = *pcVar1;
      local_20 = local_20 + 1;
    }
    *local_20 = '\0';
    p_local = (char **)nidtemp;
  }
  else {
    p_local = (char **)0x0;
  }
  return (char *)p_local;
}

Assistant:

char* GetID(char*& p) {
	char* np = nidtemp;
	if (SkipBlanks(p) || (!isLabelStart(p, false) && *p != '.')) return nullptr;
	while (islabchar((byte)*p)) *np++ = *p++;
	*np = 0;
	return nidtemp;
}